

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.c
# Opt level: O0

int handle_connection(int fd,ptls_context_t *ctx,char *server_name,
                     ptls_handshake_properties_t *hsprop)

{
  int iVar1;
  ptls_t *tls_00;
  size_t sVar2;
  int *piVar3;
  bool bVar4;
  fd_set *__arr;
  undefined1 auStack_d08 [4];
  uint __i;
  fd_set readfds;
  ssize_t rret;
  size_t roff;
  size_t early_data_size;
  undefined1 auStack_c58 [4];
  int ret;
  ptls_buffer_t wbuf;
  uint8_t early_data [1024];
  uint8_t wbuf_small [1024];
  uint8_t rbuf [1024];
  ptls_t *tls;
  ptls_handshake_properties_t *hsprop_local;
  char *server_name_local;
  ptls_context_t *ctx_local;
  int fd_local;
  
  tls_00 = ptls_new(ctx,server_name);
  roff = 0;
  if (((server_name != (char *)0x0) && ((hsprop->client).max_early_data_size != (size_t *)0x0)) &&
     (sVar2 = read(0,&wbuf.is_allocated,0x400), 0 < (long)sVar2)) {
    roff = sVar2;
  }
  ptls_buffer_init((ptls_buffer_t *)auStack_c58,early_data + 0x3f8,0x400);
  rret = 0x400;
  join_0x00000010_0x00000000_ = ptls_iovec_init(&wbuf.is_allocated,roff);
  iVar1 = run_handshake(fd,tls_00,(ptls_buffer_t *)auStack_c58,wbuf_small + 0x3f8,(size_t *)&rret,
                        hsprop,join_0x00000010_0x00000000_);
  if (iVar1 != 0) goto LAB_00104a61;
  wbuf.capacity = 0;
  if ((roff != 0) && (-1 < (char)(*(char *)((long)hsprop + 0x18) << 7))) {
    early_data_size._4_4_ = ptls_send(tls_00,(ptls_buffer_t *)auStack_c58,&wbuf.is_allocated,roff);
    if (early_data_size._4_4_ != 0) {
      fprintf(_stderr,"ptls_send:%d\n",(ulong)early_data_size._4_4_);
      goto LAB_00104a61;
    }
    iVar1 = write_all(fd,_auStack_c58,wbuf.capacity);
    if (iVar1 != 0) goto LAB_00104a61;
  }
  wbuf.capacity = 0;
  iVar1 = decrypt_and_print(tls_00,wbuf_small + 0x3f8,rret);
  if (iVar1 == 0) {
    rret = 0;
    do {
      do {
        for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
          readfds.__fds_bits[(ulong)__arr._4_4_ - 1] = 0;
        }
        _auStack_d08 = _auStack_d08 | 1;
        readfds.__fds_bits[(long)(fd / 0x40) + -1] =
             1L << ((byte)((long)fd % 0x40) & 0x3f) | readfds.__fds_bits[(long)(fd / 0x40) + -1];
        iVar1 = select(fd + 1,(fd_set *)auStack_d08,(fd_set *)0x0,(fd_set *)0x0,(timeval *)0x0);
      } while (iVar1 < 1);
      if ((_auStack_d08 & 1) != 0) {
        do {
          sVar2 = read(0,wbuf_small + 0x3f8,0x400);
          bVar4 = false;
          if (sVar2 == 1) {
            piVar3 = __errno_location();
            bVar4 = *piVar3 == 4;
          }
        } while (bVar4);
        early_data_size._4_4_ =
             ptls_send(tls_00,(ptls_buffer_t *)auStack_c58,wbuf_small + 0x3f8,sVar2);
        if (early_data_size._4_4_ != 0) {
          fprintf(_stderr,"ptls_send:%d\n",(ulong)early_data_size._4_4_);
          break;
        }
        iVar1 = write_all(fd,_auStack_c58,wbuf.capacity);
        if (iVar1 != 0) break;
        wbuf.capacity = 0;
      }
      if ((readfds.__fds_bits[(long)(fd / 0x40) + -1] & 1L << ((byte)((long)fd % 0x40) & 0x3f)) != 0
         ) {
        do {
          sVar2 = read(fd,wbuf_small + 0x3f8,0x400);
          bVar4 = false;
          if (sVar2 == 1) {
            piVar3 = __errno_location();
            bVar4 = *piVar3 == 4;
          }
        } while (bVar4);
        if (((long)sVar2 < 1) ||
           (iVar1 = decrypt_and_print(tls_00,wbuf_small + 0x3f8,sVar2), iVar1 != 0)) break;
      }
    } while( true );
  }
LAB_00104a61:
  ptls_buffer_dispose((ptls_buffer_t *)auStack_c58);
  ptls_free(tls_00);
  return 0;
}

Assistant:

static int handle_connection(int fd, ptls_context_t *ctx, const char *server_name, ptls_handshake_properties_t *hsprop)
{
    ptls_t *tls = ptls_new(ctx, server_name);
    uint8_t rbuf[1024], wbuf_small[1024], early_data[1024];
    ptls_buffer_t wbuf;
    int ret;
    size_t early_data_size = 0, roff;
    ssize_t rret;

    if (server_name != NULL && hsprop->client.max_early_data_size != NULL) {
        /* using early data */
        if ((rret = read(0, early_data, sizeof(early_data))) > 0)
            early_data_size = rret;
    }

    ptls_buffer_init(&wbuf, wbuf_small, sizeof(wbuf_small));

    roff = sizeof(rbuf);
    if (run_handshake(fd, tls, &wbuf, rbuf, &roff, hsprop, ptls_iovec_init(early_data, early_data_size)) != 0)
        goto Exit;
    wbuf.off = 0;

    /* re-send early data if necessary */
    if (early_data_size != 0 && !hsprop->client.early_data_accepted_by_peer) {
        if ((ret = ptls_send(tls, &wbuf, early_data, early_data_size)) != 0) {
            fprintf(stderr, "ptls_send:%d\n", ret);
            goto Exit;
        }
        if (write_all(fd, wbuf.base, wbuf.off) != 0)
            goto Exit;
        wbuf.off = 0;
    }

    /* process pending post-handshake data (if any) */
    if (decrypt_and_print(tls, rbuf, roff) != 0)
        goto Exit;
    roff = 0;

    /* do the communication */
    while (1) {

        /* wait for either of STDIN or read-side of the socket to become available */
        fd_set readfds;
        FD_ZERO(&readfds);
        FD_SET(0, &readfds);
        FD_SET(fd, &readfds);
        if (select(fd + 1, &readfds, NULL, NULL, NULL) <= 0)
            continue;

        if (FD_ISSET(0, &readfds)) {
            /* read from stdin, encrypt and send */
            while ((rret = read(0, rbuf, sizeof(rbuf))) == 1 && errno == EINTR)
                ;
            if ((ret = ptls_send(tls, &wbuf, rbuf, rret)) != 0) {
                fprintf(stderr, "ptls_send:%d\n", ret);
                goto Exit;
            }
            if (write_all(fd, wbuf.base, wbuf.off) != 0)
                goto Exit;
            wbuf.off = 0;
        }

        if (FD_ISSET(fd, &readfds)) {
            /* read from socket, decrypt and print */
            while ((rret = read(fd, rbuf, sizeof(rbuf))) == 1 && errno == EINTR)
                ;
            if (rret <= 0)
                goto Exit;
            if (decrypt_and_print(tls, rbuf, rret) != 0)
                goto Exit;
        }
    }

Exit:
    ptls_buffer_dispose(&wbuf);
    ptls_free(tls);
    return 0;
}